

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pci.cpp
# Opt level: O3

void ixy::write_io32(ostream *s,size_t offset,uint32_t value)

{
  size_t sVar1;
  uint32_t local_24;
  LogData<ixy::Pair<ixy::None,_const_char_*>_> local_20;
  
  local_24 = value;
  std::ostream::seekp(s,offset,0);
  sVar1 = std::ostream::tellp();
  if (sVar1 == offset) {
    std::ostream::write((char *)s,(long)&local_24);
    if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) != 0) {
      local_20.list.second = "failed to write IO resource";
      error<ixy::Pair<ixy::None,char_const*>>
                ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp"
                 ,0x91,"write_io32",&local_20);
    }
    return;
  }
  __assert_fail("(size_t) s.tellp() == offset",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/pci.cpp",
                0x8e,"void ixy::write_io32(std::ostream &, size_t, uint32_t)");
}

Assistant:

void write_io32(std::ostream &s, size_t offset, uint32_t value) {
    s.seekp(offset);
    assert((size_t) s.tellp() == offset);
    s.write(reinterpret_cast<char *>(&value), sizeof(value));
    if (!s) {
        error("failed to write IO resource");
    }
}